

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::ImageAtomicOpCase::iterate(ImageAtomicOpCase *this)

{
  size_type *__x;
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  RenderContext *renderCtx;
  bool bVar4;
  ContextType CVar5;
  GLSLVersion version;
  int iVar6;
  deUint32 dVar7;
  GLuint GVar8;
  GLenum GVar9;
  char *pcVar10;
  size_t sVar11;
  ostream *poVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestError *pTVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  pointer puVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputValues;
  BufferMemMap bufMap;
  InterfaceBlockInfo blockInfo;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels;
  Texture outputTexture;
  Buffer inputBuffer;
  Framebuffer fbo;
  Random rnd;
  InterfaceVariableInfo valueInfo;
  ShaderProgram program;
  ostringstream src;
  int local_4ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4e8;
  undefined1 local_4d0 [32];
  InterfaceBlockInfo local_4b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_468;
  ObjectWrapper local_450;
  ObjectWrapper local_438;
  ObjectWrapper local_420;
  deRandom local_408;
  undefined1 local_3f8 [8];
  pointer local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  pointer local_3d8;
  deUint32 local_3d0;
  undefined8 local_3cc;
  uint uStack_3c4;
  int iStack_3c0;
  undefined5 uStack_3bc;
  undefined8 uStack_3b7;
  ios_base local_380 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_368;
  undefined1 local_348 [208];
  ShaderProgram local_278;
  undefined1 local_1a8 [376];
  Functions *gl;
  
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(CVar5);
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(CVar5,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar10 = glu::getGLSLVersionDeclaration(version);
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)(&stack0xfffffffffffffb08 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18))
                    + 0x350);
  }
  else {
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  pcVar10 = "#extension GL_OES_shader_image_atomic : require\n";
  if (bVar4) {
    pcVar10 = "\n";
  }
  lVar15 = 0x30;
  if (bVar4) {
    lVar15 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
  poVar12 = (ostream *)std::ostream::operator<<(local_1a8,this->m_localSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"layout(r32ui, binding = 1) uniform highp uimage2D u_dstImg;\n",0x3c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"buffer Input {\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    uint values[",0x10);
  poVar12 = (ostream *)
            std::ostream::operator<<
                      (poVar12,(this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0] *
                               this->m_localSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"} sb_in;\n\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
             ,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"    if (gl_LocalInvocationIndex == 0u)\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"        imageStore(u_dstImg, ivec2(gl_WorkGroupID.xy), uvec4(0));\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    barrier();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"    imageAtomicAdd(u_dstImg, ivec2(gl_WorkGroupID.xy), value);\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"}\n",2);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar6);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_438,(Functions *)CONCAT44(extraout_var_00,iVar6),pOVar13)
  ;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&local_450,(Functions *)CONCAT44(extraout_var_01,iVar6),pOVar13)
  ;
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_3f8,0,0xac);
  local_348._0_8_ = (pointer)0x0;
  local_348[8] = 0;
  local_348._9_7_ = 0;
  local_348[0x10] = 0;
  local_348._17_8_ = 0;
  std::__cxx11::stringbuf::str();
  __x = &local_4b0.name._M_string_length;
  local_4b0.name._M_dataplus._M_p._0_4_ = 5;
  puVar1 = (undefined1 *)((long)&local_4b0.name.field_2 + 8);
  local_4b0.name._M_string_length = (size_type)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__x,local_4d0._0_8_,
             (pointer)(local_4d0._0_8_ + CONCAT44(local_4d0._12_4_,local_4d0._8_4_)));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + ((ulong)local_4b0.name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)__x);
  glu::ShaderProgram::ShaderProgram(&local_278,renderCtx,(ProgramSources *)local_3f8);
  if ((undefined1 *)local_4b0.name._M_string_length != puVar1) {
    operator_delete((void *)local_4b0.name._M_string_length,local_4b0.name.field_2._8_8_ + 1);
  }
  if ((Functions *)local_4d0._0_8_ != (Functions *)(local_4d0 + 0x10)) {
    operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_368);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  deRandom_init(&local_408,0x77238ac2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_4e8,
             (long)((this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0] *
                   this->m_localSize),(allocator_type *)local_3f8);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_278
                 );
  if (local_278.m_program.m_info.linkOk == false) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x500);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_3f8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3f0,"Work groups: ",0xd);
  tcu::operator<<((ostream *)&local_3f0,&this->m_imageSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3f0);
  std::ios_base::~ios_base(local_380);
  (*gl->useProgram)(local_278.m_program.m_program);
  if (local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar21 = local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      dVar7 = deRandom_getUint32(&local_408);
      *puVar21 = dVar7;
      puVar21 = puVar21 + 1;
    } while (puVar21 !=
             local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  GVar8 = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e6,"Input");
  paVar2 = &local_4b0.name.field_2;
  local_4b0.name._M_string_length = 0;
  local_4b0.name.field_2._M_local_buf[0] = '\0';
  local_4b0.index = 0xffffffff;
  local_4b0.bufferBinding = 0;
  local_4b0.dataSize = 0;
  local_4b0.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b0.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b0.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b0.name._M_dataplus._M_p = (pointer)paVar2;
  glu::getProgramInterfaceBlockInfo(gl,local_278.m_program.m_program,0x92e6,GVar8,&local_4b0);
  GVar8 = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e5,"Input.values");
  local_3f0 = (pointer)0x0;
  local_3e8._M_local_buf[0] = '\0';
  local_3d8 = (pointer)&DAT_ffffffffffffffff;
  local_3d0 = 0xffffffff;
  local_3cc = 0;
  uStack_3c4 = 0;
  iStack_3c0 = 0;
  uStack_3bc = 0;
  uStack_3b7 = 0;
  local_3f8 = (undefined1  [8])&local_3e8;
  glu::getProgramInterfaceVariableInfo
            (gl,local_278.m_program.m_program,0x92e5,GVar8,(InterfaceVariableInfo *)local_3f8);
  (*gl->bindBuffer)(0x90d2,local_438.m_object);
  (*gl->bufferData)(0x90d2,(ulong)local_4b0.dataSize,(void *)0x0,0x88e4);
  if (local_3cc._4_4_ !=
      (deUint32)
      ((ulong)((long)local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x514);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  BufferMemMap::BufferMemMap((BufferMemMap *)local_4d0,gl,0x90d2,0,local_4b0.dataSize,2);
  uVar16 = (ulong)((long)local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 2;
  if ((int)uVar16 != 0) {
    uVar17 = 0;
    do {
      *(uint *)((ulong)(uint)(iStack_3c0 * (int)uVar17) + (ulong)uStack_3c4 + local_4d0._16_8_) =
           local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar17];
      uVar17 = uVar17 + 1;
    } while ((uVar16 & 0xffffffff) != uVar17);
  }
  (**(glUnmapBufferFunc *)(local_4d0._0_8_ + 0x1670))(local_4d0._8_4_);
  (*gl->bindBufferBase)(0x90d2,local_4b0.bufferBinding,local_438.m_object);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"Input buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x51e);
  if (local_3f8 != (undefined1  [8])&local_3e8) {
    operator_delete((void *)local_3f8,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  if (local_4b0.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b0.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4b0.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b0.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_4b0.name._M_dataplus._M_p,
                    CONCAT71(local_4b0.name.field_2._M_allocated_capacity._1_7_,
                             local_4b0.name.field_2._M_local_buf[0]) + 1);
  }
  (*gl->bindTexture)(0xde1,local_450.m_object);
  (*gl->texStorage2D)(0xde1,1,0x8236,(this->m_imageSize).m_data[0],(this->m_imageSize).m_data[1]);
  (*gl->texParameteri)(0xde1,0x2801,0x2600);
  (*gl->texParameteri)(0xde1,0x2800,0x2600);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"Uploading image data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x526);
  (*gl->bindImageTexture)(1,local_450.m_object,0,'\0',0,0x88ba,0x8236);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"Image setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x52a);
  (*gl->dispatchCompute)((this->m_imageSize).m_data[0],(this->m_imageSize).m_data[1],1);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x52e);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_420,(Functions *)CONCAT44(extraout_var_02,iVar6),pOVar13)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_468,(long)((this->m_imageSize).m_data[0] * (this->m_imageSize).m_data[1] * 4),
             (allocator_type *)local_3f8);
  (*gl->bindFramebuffer)(0x8d40,local_420.m_object);
  (*gl->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,local_450.m_object,0);
  GVar9 = (*gl->checkFramebufferStatus)(0x8d40);
  if (GVar9 == 0x8cd5) {
    (*gl->readBuffer)(0x8ce0);
    (*gl->readPixels)(0,0,(this->m_imageSize).m_data[0],(this->m_imageSize).m_data[1],0x8d99,0x1405,
                      local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    GVar9 = (*gl->getError)();
    glu::checkError(GVar9,"Reading pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x53c);
    uVar16 = (ulong)((long)local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2;
    uVar3 = this->m_localSize;
    uVar16 = (long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) /
             (long)(int)uVar3;
    local_4ec = 0;
    if (0 < (int)uVar16) {
      iVar6 = 0;
      uVar17 = 0;
      do {
        uVar18 = 0;
        if (0 < (int)uVar3) {
          uVar18 = 0;
          uVar19 = (ulong)uVar3;
          iVar20 = iVar6;
          do {
            uVar18 = uVar18 + local_4e8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[iVar20];
            iVar20 = iVar20 + 1;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
        }
        if (local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar17 * 4] != uVar18) {
          pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
          local_4b0.name._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4b0,"Comparison failed for pixel ","");
          de::toString<int>((string *)local_4d0,&local_4ec);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3f8,&local_4b0.name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4d0);
          tcu::TestError::TestError(pTVar14,(string *)local_3f8);
          __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        uVar17 = uVar17 + 1;
        local_4ec = (int)uVar17;
        iVar6 = iVar6 + uVar3;
      } while (uVar17 != (uVar16 & 0xffffffff));
    }
    if (local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_468.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_468.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_468.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    glu::ObjectWrapper::~ObjectWrapper(&local_420);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    if (local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (deUint32 *)0x0) {
      operator_delete(local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    glu::ShaderProgram::~ShaderProgram(&local_278);
    glu::ObjectWrapper::~ObjectWrapper(&local_450);
    glu::ObjectWrapper::~ObjectWrapper(&local_438);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return STOP;
  }
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x537);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		const bool					supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< (supportsES32 ? "\n" : "#extension GL_OES_shader_image_atomic : require\n")
			<< "layout (local_size_x = " << m_localSize << ") in;\n"
			<< "layout(r32ui, binding = 1) uniform highp uimage2D u_dstImg;\n"
			<< "buffer Input {\n"
			<< "    uint values[" << (m_imageSize[0]*m_imageSize[1]*m_localSize) << "];\n"
			<< "} sb_in;\n\n"
			<< "void main (void) {\n"
			<< "    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
			<< "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
			<< "\n"
			<< "    if (gl_LocalInvocationIndex == 0u)\n"
			<< "        imageStore(u_dstImg, ivec2(gl_WorkGroupID.xy), uvec4(0));\n"
			<< "    barrier();\n"
			<< "    imageAtomicAdd(u_dstImg, ivec2(gl_WorkGroupID.xy), value);\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				inputBuffer		(m_context.getRenderContext());
		const Texture				outputTexture	(m_context.getRenderContext());
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));
		de::Random					rnd				(0x77238ac2);
		vector<deUint32>			inputValues		(m_imageSize[0]*m_imageSize[1]*m_localSize);

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_imageSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Input values
		for (vector<deUint32>::iterator i = inputValues.begin(); i != inputValues.end(); ++i)
			*i = rnd.getUint32();

		// Input buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Input");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Input.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)blockInfo.dataSize, DE_NULL, GL_STATIC_DRAW);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, (int)blockInfo.dataSize, GL_MAP_WRITE_BIT);

				for (deUint32 ndx = 0; ndx < (deUint32)inputValues.size(); ndx++)
					*(deUint32*)((deUint8*)bufMap.getPtr() + valueInfo.offset + ndx*valueInfo.arrayStride) = inputValues[ndx];
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, blockInfo.bufferBinding, *inputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Input buffer setup failed");
		}

		// Output image setup
		gl.bindTexture(GL_TEXTURE_2D, *outputTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_imageSize[0], m_imageSize[1]);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading image data failed");

		// Bind to unit 1
		gl.bindImageTexture(1, *outputTexture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Image setup failed");

		// Dispatch compute workload
		gl.dispatchCompute(m_imageSize[0], m_imageSize[1], 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			Framebuffer			fbo			(m_context.getRenderContext());
			vector<deUint32>	pixels		(m_imageSize[0]*m_imageSize[1]*4);

			gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
			gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *outputTexture, 0);
			TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

			// \note In ES3 we have to use GL_RGBA_INTEGER
			gl.readBuffer(GL_COLOR_ATTACHMENT0);
			gl.readPixels(0, 0, m_imageSize[0], m_imageSize[1], GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

			for (int pixelNdx = 0; pixelNdx < (int)inputValues.size()/m_localSize; pixelNdx++)
			{
				const deUint32	res		= pixels[pixelNdx*4];
				deUint32		ref		= 0;

				for (int offs = 0; offs < m_localSize; offs++)
					ref += inputValues[pixelNdx*m_localSize + offs];

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for pixel ") + de::toString(pixelNdx));
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}